

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int flow_set_next_outgoing_id(FLOW_HANDLE flow,transfer_number next_outgoing_id_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE next_outgoing_id_amqp_value;
  FLOW_INSTANCE *flow_instance;
  int result;
  transfer_number next_outgoing_id_value_local;
  FLOW_HANDLE flow_local;
  
  if (flow == (FLOW_HANDLE)0x0) {
    flow_instance._0_4_ = 0x17c3;
  }
  else {
    item_value = amqpvalue_create_transfer_number(next_outgoing_id_value);
    if (item_value == (AMQP_VALUE)0x0) {
      flow_instance._0_4_ = 0x17cb;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(flow->composite_value,2,item_value);
      if (iVar1 == 0) {
        flow_instance._0_4_ = 0;
      }
      else {
        flow_instance._0_4_ = 0x17d1;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)flow_instance;
}

Assistant:

int flow_set_next_outgoing_id(FLOW_HANDLE flow, transfer_number next_outgoing_id_value)
{
    int result;

    if (flow == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)flow;
        AMQP_VALUE next_outgoing_id_amqp_value = amqpvalue_create_transfer_number(next_outgoing_id_value);
        if (next_outgoing_id_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(flow_instance->composite_value, 2, next_outgoing_id_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(next_outgoing_id_amqp_value);
        }
    }

    return result;
}